

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

int findlabel(LexState *ls,int g)

{
  BlockCnt *pBVar1;
  Dyndata *pDVar2;
  int iVar3;
  Labeldesc *pLVar4;
  Labeldesc *label;
  Labeldesc *lb;
  Labeldesc *gt;
  Dyndata *dyd;
  BlockCnt *bl;
  int i;
  int g_local;
  LexState *ls_local;
  
  pBVar1 = ls->fs->bl;
  pDVar2 = ls->dyd;
  pLVar4 = (pDVar2->gt).arr + g;
  bl._0_4_ = (int)pBVar1->firstlabel;
  while( true ) {
    if ((pDVar2->label).n <= (int)bl) {
      return 0;
    }
    label = (pDVar2->label).arr + (int)bl;
    iVar3 = luaS_eqstr(label->name,pLVar4->name);
    if (iVar3 != 0) break;
    bl._0_4_ = (int)bl + 1;
  }
  if ((label->nactvar < pLVar4->nactvar) &&
     ((pBVar1->upval != '\0' || ((int)pBVar1->firstlabel < (pDVar2->label).n)))) {
    luaK_patchclose(ls->fs,pLVar4->pc,(uint)label->nactvar);
  }
  closegoto(ls,g,label);
  return 1;
}

Assistant:

static int findlabel (LexState *ls, int g) {
  int i;
  BlockCnt *bl = ls->fs->bl;
  Dyndata *dyd = ls->dyd;
  Labeldesc *gt = &dyd->gt.arr[g];
  /* check labels in current block for a match */
  for (i = bl->firstlabel; i < dyd->label.n; i++) {
    Labeldesc *lb = &dyd->label.arr[i];
    if (luaS_eqstr(lb->name, gt->name)) {  /* correct label? */
      if (gt->nactvar > lb->nactvar &&
          (bl->upval || dyd->label.n > bl->firstlabel))
        luaK_patchclose(ls->fs, gt->pc, lb->nactvar);
      closegoto(ls, g, lb);  /* close it */
      return 1;
    }
  }
  return 0;  /* label not found; cannot close goto */
}